

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O1

void tx_crash_recover_test(void)

{
  fdb_kvs_handle *pfVar1;
  fdb_status fVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  uint uVar6;
  ulong uVar7;
  char *unaff_R14;
  fdb_kvs_handle *unaff_R15;
  fdb_file_handle *file;
  fdb_kvs_handle *kvs;
  char str [15];
  void *val;
  size_t vallen;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_file_info file_info;
  fdb_kvs_handle *pfStack_340;
  fdb_kvs_handle *pfStack_338;
  fdb_file_handle *pfStack_330;
  fdb_iterator *pfStack_328;
  fdb_doc *pfStack_320;
  fdb_kvs_handle *pfStack_318;
  timeval tStack_310;
  fdb_kvs_config fStack_300;
  fdb_config fStack_2e8;
  fdb_config *pfStack_1f0;
  char *pcStack_1e8;
  fdb_kvs_handle *pfStack_1e0;
  fdb_file_handle *local_1d8;
  fdb_kvs_handle *local_1d0;
  char local_1c7 [15];
  undefined1 local_1b8 [40];
  docio_handle *pdStack_190;
  btreeblk_handle *local_188;
  timeval local_180;
  undefined1 local_170 [76];
  uint local_124;
  
  pfStack_1e0 = (fdb_kvs_handle *)0x11cc03;
  gettimeofday(&local_180,(__timezone_ptr_t)0x0);
  pfStack_1e0 = (fdb_kvs_handle *)0x11cc08;
  memleak_start();
  pfStack_1e0 = (fdb_kvs_handle *)0x11cc14;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcVar5 = local_170 + 0x48;
  pfStack_1e0 = (fdb_kvs_handle *)0x11cc24;
  fdb_get_default_config();
  pfStack_1e0 = (fdb_kvs_handle *)0x11cc36;
  fVar2 = fdb_open(&local_1d8,"./mvcc_test2",(fdb_config *)pcVar5);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf72;
  pcVar5 = local_170;
  pfStack_1e0 = (fdb_kvs_handle *)0x11cc4b;
  fdb_get_default_kvs_config();
  local_188 = (btreeblk_handle *)local_170._16_8_;
  local_1b8._32_8_ = local_170._0_8_;
  pdStack_190 = (docio_handle *)local_170._8_8_;
  pfStack_1e0 = (fdb_kvs_handle *)0x11cc6c;
  fVar2 = fdb_kvs_open_default(local_1d8,&local_1d0,(fdb_kvs_config *)(local_1b8 + 0x20));
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf77;
  pfStack_1e0 = (fdb_kvs_handle *)0x11cc82;
  fVar2 = fdb_begin_transaction(local_1d8,'\x03');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf7c;
  pcVar5 = "key%d";
  unaff_R14 = local_1c7;
  unaff_R15 = (fdb_kvs_handle *)0x1565bd;
  uVar7 = 0;
  do {
    pfStack_1e0 = (fdb_kvs_handle *)0x11ccae;
    sprintf(unaff_R14,"key%d",uVar7);
    pfVar1 = local_1d0;
    pfStack_1e0 = (fdb_kvs_handle *)0x11ccbb;
    sVar4 = strlen(unaff_R14);
    pfStack_1e0 = (fdb_kvs_handle *)0x11ccd2;
    fVar2 = fdb_set_kv(pfVar1,unaff_R14,sVar4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pfStack_1e0 = (fdb_kvs_handle *)0x11cf63;
      tx_crash_recover_test();
      goto LAB_0011cf63;
    }
    uVar6 = (int)uVar7 + 1;
    uVar7 = (ulong)uVar6;
  } while (uVar6 != 10);
  pfStack_1e0 = (fdb_kvs_handle *)0x11ccef;
  fVar2 = fdb_end_transaction(local_1d8,'\x01');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf81;
  pfStack_1e0 = (fdb_kvs_handle *)0x11cd07;
  fdb_compact(local_1d8,"./mvcc_test3");
  pfStack_1e0 = (fdb_kvs_handle *)0x11cd15;
  fVar2 = fdb_begin_transaction(local_1d8,'\x03');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf86;
  pcVar5 = "key%d";
  unaff_R14 = local_1c7;
  uVar6 = 0;
  do {
    pfStack_1e0 = (fdb_kvs_handle *)0x11cd3a;
    sprintf(unaff_R14,"key%d",(ulong)uVar6);
    unaff_R15 = local_1d0;
    pfStack_1e0 = (fdb_kvs_handle *)0x11cd47;
    sVar4 = strlen(unaff_R14);
    pfStack_1e0 = (fdb_kvs_handle *)0x11cd55;
    fVar2 = fdb_del_kv(unaff_R15,unaff_R14,sVar4);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf63;
    uVar6 = uVar6 + 1;
  } while (uVar6 != 10);
  pfStack_1e0 = (fdb_kvs_handle *)0x11cd72;
  fVar2 = fdb_get_file_info(local_1d8,(fdb_file_info *)local_170);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf8b;
  pcVar5 = (char *)((ulong)local_170._40_8_ / (ulong)local_124);
  pfStack_1e0 = (fdb_kvs_handle *)0x11cd9a;
  fdb_close(local_1d8);
  pfStack_1e0 = (fdb_kvs_handle *)0x11cd9f;
  fdb_shutdown();
  pfStack_1e0 = (fdb_kvs_handle *)0x11cdbe;
  iVar3 = _disk_dump("./mvcc_test3",(ulong)local_124 * (long)pcVar5,
                     (ulong)((local_124 >> 2) + local_124 * 2));
  if (iVar3 < 0) goto LAB_0011cf90;
  pfStack_1e0 = (fdb_kvs_handle *)0x11cde8;
  iVar3 = _disk_dump("./mvcc_test2",((long)pcVar5 * 4 + 8) * (ulong)local_124,
                     (ulong)(local_124 >> 2));
  if (iVar3 < 0) goto LAB_0011cf95;
  pfStack_1e0 = (fdb_kvs_handle *)0x11ce07;
  fVar2 = fdb_open(&local_1d8,"./mvcc_test3",(fdb_config *)(local_170 + 0x48));
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf9a;
  pcVar5 = local_1b8;
  pfStack_1e0 = (fdb_kvs_handle *)0x11ce1c;
  fdb_get_default_kvs_config();
  local_188 = (btreeblk_handle *)local_1b8._16_8_;
  local_1b8._32_8_ = local_1b8._0_8_;
  pdStack_190 = (docio_handle *)local_1b8._8_8_;
  pfStack_1e0 = (fdb_kvs_handle *)0x11ce3d;
  fVar2 = fdb_kvs_open_default(local_1d8,&local_1d0,(fdb_kvs_config *)(local_1b8 + 0x20));
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf9f;
  pfStack_1e0 = (fdb_kvs_handle *)0x11ce53;
  fVar2 = fdb_begin_transaction(local_1d8,'\x03');
  if (fVar2 == FDB_RESULT_SUCCESS) {
    uVar6 = 0;
    do {
      pfStack_1e0 = (fdb_kvs_handle *)0x11ce78;
      sprintf(local_1c7,"key%d",(ulong)uVar6);
      unaff_R15 = local_1d0;
      pfStack_1e0 = (fdb_kvs_handle *)0x11ce85;
      sVar4 = strlen(local_1c7);
      pfStack_1e0 = (fdb_kvs_handle *)0x11ce93;
      fVar2 = fdb_del_kv(unaff_R15,local_1c7,sVar4);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cf68;
      uVar6 = uVar6 + 1;
    } while (uVar6 != 10);
    pfStack_1e0 = (fdb_kvs_handle *)0x11ceab;
    fdb_abort_transaction(local_1d8);
    unaff_R15 = (fdb_kvs_handle *)local_1b8;
    uVar6 = 0;
    while( true ) {
      pfStack_1e0 = (fdb_kvs_handle *)0x11ced2;
      sprintf(local_1c7,"key%d",(ulong)uVar6);
      pfVar1 = local_1d0;
      pfStack_1e0 = (fdb_kvs_handle *)0x11cedf;
      sVar4 = strlen(local_1c7);
      pfStack_1e0 = (fdb_kvs_handle *)0x11cef3;
      fVar2 = fdb_get_kv(pfVar1,local_1c7,sVar4,(void **)unaff_R15,(size_t *)(local_1b8 + 0x18));
      if (fVar2 != FDB_RESULT_SUCCESS) break;
      pfStack_1e0 = (fdb_kvs_handle *)0x11cf01;
      free((void *)local_1b8._0_8_);
      uVar6 = uVar6 + 1;
      if (uVar6 == 10) {
        pfStack_1e0 = (fdb_kvs_handle *)0x11cf11;
        fdb_close(local_1d8);
        pfStack_1e0 = (fdb_kvs_handle *)0x11cf16;
        fdb_shutdown();
        pfStack_1e0 = (fdb_kvs_handle *)0x11cf1b;
        memleak_end();
        pcVar5 = "%s PASSED\n";
        if (tx_crash_recover_test()::__test_pass != '\0') {
          pcVar5 = "%s FAILED\n";
        }
        pfStack_1e0 = (fdb_kvs_handle *)0x11cf4c;
        fprintf(_stderr,pcVar5,"crash recover test");
        return;
      }
    }
    goto LAB_0011cf6d;
  }
  goto LAB_0011cfa4;
LAB_0011cf63:
  pfStack_1e0 = (fdb_kvs_handle *)0x11cf68;
  tx_crash_recover_test();
LAB_0011cf68:
  pfStack_1e0 = (fdb_kvs_handle *)0x11cf6d;
  tx_crash_recover_test();
LAB_0011cf6d:
  unaff_R14 = local_1c7;
  pcVar5 = "key%d";
  pfStack_1e0 = (fdb_kvs_handle *)0x11cf72;
  tx_crash_recover_test();
LAB_0011cf72:
  pfStack_1e0 = (fdb_kvs_handle *)0x11cf77;
  tx_crash_recover_test();
LAB_0011cf77:
  pfStack_1e0 = (fdb_kvs_handle *)0x11cf7c;
  tx_crash_recover_test();
LAB_0011cf7c:
  pfStack_1e0 = (fdb_kvs_handle *)0x11cf81;
  tx_crash_recover_test();
LAB_0011cf81:
  pfStack_1e0 = (fdb_kvs_handle *)0x11cf86;
  tx_crash_recover_test();
LAB_0011cf86:
  pfStack_1e0 = (fdb_kvs_handle *)0x11cf8b;
  tx_crash_recover_test();
LAB_0011cf8b:
  pfStack_1e0 = (fdb_kvs_handle *)0x11cf90;
  tx_crash_recover_test();
LAB_0011cf90:
  pfStack_1e0 = (fdb_kvs_handle *)0x11cf95;
  tx_crash_recover_test();
LAB_0011cf95:
  pfStack_1e0 = (fdb_kvs_handle *)0x11cf9a;
  tx_crash_recover_test();
LAB_0011cf9a:
  pfStack_1e0 = (fdb_kvs_handle *)0x11cf9f;
  tx_crash_recover_test();
LAB_0011cf9f:
  pfStack_1e0 = (fdb_kvs_handle *)0x11cfa4;
  tx_crash_recover_test();
LAB_0011cfa4:
  pfStack_1e0 = (fdb_kvs_handle *)drop_kv_on_snap_iterator_test;
  tx_crash_recover_test();
  pfStack_1f0 = (fdb_config *)pcVar5;
  pcStack_1e8 = unaff_R14;
  pfStack_1e0 = unaff_R15;
  gettimeofday(&tStack_310,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  pfStack_320 = (fdb_doc *)0x0;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_open(&pfStack_330,"./mvcc_test1",&fStack_2e8);
  fdb_kvs_open_default(pfStack_330,&pfStack_318,&fStack_300);
  fdb_kvs_open(pfStack_330,&pfStack_338,"kv",&fStack_300);
  fVar2 = fdb_set_kv(pfStack_338,"a",1,(void *)0x0,0);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_set_kv(pfStack_338,"b",1,(void *)0x0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1c2;
    fdb_commit(pfStack_330,'\x01');
    fVar2 = fdb_snapshot_open(pfStack_338,&pfStack_340,2);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1c9;
    fVar2 = fdb_iterator_init(pfStack_340,&pfStack_328,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1ce;
    fVar2 = fdb_kvs_close(pfStack_340);
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011d1d3;
    fVar2 = fdb_kvs_close(pfStack_338);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1d8;
    fVar2 = fdb_kvs_remove(pfStack_330,"kv");
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011d1dd;
    fVar2 = fdb_iterator_get(pfStack_328,&pfStack_320);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1e2;
    fdb_doc_free(pfStack_320);
    fVar2 = fdb_iterator_close(pfStack_328);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1e7;
    fVar2 = fdb_kvs_close(pfStack_340);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d1ec;
    fVar2 = fdb_kvs_close(pfStack_318);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fVar2 = fdb_close(pfStack_330);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        fdb_shutdown();
        memleak_end();
        pcVar5 = "%s PASSED\n";
        if (drop_kv_on_snap_iterator_test()::__test_pass != '\0') {
          pcVar5 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar5,"drop kv other handle test");
        return;
      }
      goto LAB_0011d1f6;
    }
  }
  else {
    drop_kv_on_snap_iterator_test();
LAB_0011d1c2:
    drop_kv_on_snap_iterator_test();
LAB_0011d1c9:
    drop_kv_on_snap_iterator_test();
LAB_0011d1ce:
    drop_kv_on_snap_iterator_test();
LAB_0011d1d3:
    drop_kv_on_snap_iterator_test();
LAB_0011d1d8:
    drop_kv_on_snap_iterator_test();
LAB_0011d1dd:
    drop_kv_on_snap_iterator_test();
LAB_0011d1e2:
    drop_kv_on_snap_iterator_test();
LAB_0011d1e7:
    drop_kv_on_snap_iterator_test();
LAB_0011d1ec:
    drop_kv_on_snap_iterator_test();
  }
  drop_kv_on_snap_iterator_test();
LAB_0011d1f6:
  drop_kv_on_snap_iterator_test();
  concurrent_writer_iterator_test();
  in_memory_snapshot_cleanup_test();
  drop_kv_on_snap_iterator_test();
  rollback_secondary_kvs();
  multi_version_test();
  crash_recovery_test(true);
  crash_recovery_test(false);
  snapshot_test();
  in_memory_snapshot_rollback_test();
  in_memory_snapshot_test();
  in_memory_snapshot_on_dirty_hbtrie_test();
  in_memory_snapshot_compaction_test();
  snapshot_clone_test();
  snapshot_parallel_clone_test();
  snapshot_stats_test();
  snapshot_with_uncomitted_data_test();
  snapshot_markers_in_file_test(true);
  snapshot_markers_in_file_test(false);
  snapshot_with_deletes_test();
  snapshot_without_seqtree(true);
  snapshot_without_seqtree(false);
  rollback_during_ops_test((void *)0x0);
  rollback_forward_seqnum();
  rollback_test(false);
  rollback_test(true);
  rollback_and_snapshot_test();
  rollback_ncommits();
  transaction_test();
  transaction_simple_api_test();
  transaction_in_memory_snapshot_test();
  rollback_prior_to_ops(true);
  rollback_prior_to_ops(false);
  snapshot_concurrent_compaction_test();
  rollback_to_zero_test(true);
  rollback_to_zero_test(false);
  rollback_to_zero_after_compact_test(false);
  rollback_to_zero_after_compact_test(true);
  rollback_all_test(true);
  rollback_all_test(false);
  rollback_to_wal_test(true);
  rollback_to_wal_test(false);
  rollback_drop_multi_files_kvs_test();
  rollback_without_seqtree(true);
  rollback_without_seqtree(false);
  tx_crash_recover_test();
  auto_compaction_snapshots_test();
  return;
}

Assistant:

void tx_crash_recover_test()
{
    TEST_INIT();
    memleak_start();

    int i, r;
    char str[15];
    void *val;
    size_t vallen;

    fdb_file_handle *file;
    fdb_kvs_handle *kvs;
    fdb_status status;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_file_info file_info;
    uint64_t bid;
    const char *test_file = "./mvcc_test2";
    const char *test_file_c = "./mvcc_test3";

    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    config = fdb_get_default_config();
    status = fdb_open(&file, test_file, &config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    kvs_config = fdb_get_default_kvs_config();
    status = fdb_kvs_open_default(file, &kvs, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // set keys in transaction
    status = fdb_begin_transaction(file, FDB_ISOLATION_READ_UNCOMMITTED);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    for(i=0;i<10;i++){
        sprintf(str, "key%d", i);
        status = fdb_set_kv(kvs, str, strlen(str), (void*)"value", 5);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }
    status = fdb_end_transaction(file, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // custom compact
    fdb_compact(file, test_file_c);

    // begin a tx to delete keys
    status = fdb_begin_transaction(file, FDB_ISOLATION_READ_UNCOMMITTED);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    for(i=0;i<10;i++){
        sprintf(str, "key%d", i);
        status = fdb_del_kv(kvs, str, strlen(str));
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    status = fdb_get_file_info(file, &file_info);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    bid = file_info.file_size / config.blocksize;

    // simulate crash
    fdb_close(file);
    fdb_shutdown();

    // Now append 9K of non-block aligned garbage at the end of the file..
    r = _disk_dump(test_file_c, bid * config.blocksize,
                  (config.blocksize * 2) + (config.blocksize / 4));
    TEST_CHK(r >= 0);

    // also write non-block aligned garbage to old compact file
    r = _disk_dump(test_file, (bid + 2)*4*config.blocksize, config.blocksize/4);
    TEST_CHK(r >= 0);

    // reopen
    status = fdb_open(&file, test_file_c, &config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    kvs_config = fdb_get_default_kvs_config();
    status = fdb_kvs_open_default(file, &kvs, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // restart tx to delete keys
    status = fdb_begin_transaction(file, FDB_ISOLATION_READ_UNCOMMITTED);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    for(i=0;i<10;i++){
        sprintf(str, "key%d", i);
        status = fdb_del_kv(kvs, str, strlen(str));
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // abort tx
    fdb_abort_transaction(file);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // keys from original tx should be recoverable
    for(i=0;i<10;i++){
       sprintf(str, "key%d", i);
       status = fdb_get_kv(kvs, str, strlen(str), &val, &vallen);
       TEST_CHK(status == FDB_RESULT_SUCCESS);
       free(val);
    }

    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_close(file);
    fdb_shutdown();
    memleak_end();
    TEST_RESULT("crash recover test");
}